

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void print_basic_type(FILE *f,basic_type basic_type)

{
  basic_type basic_type_local;
  FILE *f_local;
  
  switch(basic_type) {
  case TP_UNDEF:
    fprintf((FILE *)f,"undef type");
    break;
  case TP_VOID:
    fprintf((FILE *)f,"void");
    break;
  case TP_BOOL:
    fprintf((FILE *)f,"bool");
    break;
  case TP_CHAR:
    fprintf((FILE *)f,"char");
    break;
  case TP_SCHAR:
    fprintf((FILE *)f,"signed char");
    break;
  case TP_UCHAR:
    fprintf((FILE *)f,"unsigned char");
    break;
  case TP_SHORT:
    fprintf((FILE *)f,"short");
    break;
  case TP_USHORT:
    fprintf((FILE *)f,"unsigned short");
    break;
  case TP_INT:
    fprintf((FILE *)f,"int");
    break;
  case TP_UINT:
    fprintf((FILE *)f,"unsigned int");
    break;
  case TP_LONG:
    fprintf((FILE *)f,"long");
    break;
  case TP_ULONG:
    fprintf((FILE *)f,"unsigned long");
    break;
  case TP_LLONG:
    fprintf((FILE *)f,"long long");
    break;
  case TP_ULLONG:
    fprintf((FILE *)f,"unsigned long long");
    break;
  case TP_FLOAT:
    fprintf((FILE *)f,"float");
    break;
  case TP_DOUBLE:
    fprintf((FILE *)f,"double");
    break;
  case TP_LDOUBLE:
    fprintf((FILE *)f,"long double");
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3563,"void print_basic_type(FILE *, enum basic_type)");
  }
  return;
}

Assistant:

static void print_basic_type (FILE *f, enum basic_type basic_type) {
  switch (basic_type) {
  case TP_UNDEF: fprintf (f, "undef type"); break;
  case TP_VOID: fprintf (f, "void"); break;
  case TP_BOOL: fprintf (f, "bool"); break;
  case TP_CHAR: fprintf (f, "char"); break;
  case TP_SCHAR: fprintf (f, "signed char"); break;
  case TP_UCHAR: fprintf (f, "unsigned char"); break;
  case TP_SHORT: fprintf (f, "short"); break;
  case TP_USHORT: fprintf (f, "unsigned short"); break;
  case TP_INT: fprintf (f, "int"); break;
  case TP_UINT: fprintf (f, "unsigned int"); break;
  case TP_LONG: fprintf (f, "long"); break;
  case TP_ULONG: fprintf (f, "unsigned long"); break;
  case TP_LLONG: fprintf (f, "long long"); break;
  case TP_ULLONG: fprintf (f, "unsigned long long"); break;
  case TP_FLOAT: fprintf (f, "float"); break;
  case TP_DOUBLE: fprintf (f, "double"); break;
  case TP_LDOUBLE: fprintf (f, "long double"); break;
  default: assert (FALSE);
  }
}